

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::GraphicsCacheTestInstance::prepareCommandBuffer
          (GraphicsCacheTestInstance *this)

{
  VkResult VVar1;
  DeviceInterface *pDVar2;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  
  pDVar2 = Context::getDeviceInterface((this->super_CacheTestInstance).super_TestInstance.m_context)
  ;
  VVar1 = (*pDVar2->_vptr_DeviceInterface[0x49])
                    (pDVar2,(this->super_CacheTestInstance).m_cmdBuffer.
                            super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar1,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x45a);
  (*pDVar2->_vptr_DeviceInterface[0x6d])
            (pDVar2,(this->super_CacheTestInstance).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,0x80,0,0,0,0,0,3,
             this->m_imageLayoutBarriers);
  prepareRenderPass(this,(VkFramebuffer)
                         this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>.
                         m_data.object.m_internal,
                    (VkPipeline)
                    this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object
                    .m_internal);
  prepareRenderPass(this,(VkFramebuffer)
                         this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.
                         m_data.object.m_internal,
                    (VkPipeline)
                    this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object
                    .m_internal);
  VVar1 = (*pDVar2->_vptr_DeviceInterface[0x4a])
                    (pDVar2,(this->super_CacheTestInstance).m_cmdBuffer.
                            super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar1,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x465);
  return;
}

Assistant:

void GraphicsCacheTestInstance::prepareCommandBuffer (void)
{
	const DeviceInterface&  vk               = m_context.getDeviceInterface();

	const VkCommandBufferBeginInfo cmdBufferBeginInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,    // VkStructureType                  sType;
		DE_NULL,                                        // const void*                      pNext;
		0u,                                             // VkCommandBufferUsageFlags        flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	VK_CHECK(vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo));

	vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, (VkDependencyFlags)0,
		0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(m_imageLayoutBarriers), m_imageLayoutBarriers);

	prepareRenderPass(*m_framebuffer[PIPELINE_CACHE_NDX_NO_CACHE], *m_pipeline[PIPELINE_CACHE_NDX_NO_CACHE]);

	// After the first render pass, the images are in correct layouts

	prepareRenderPass(*m_framebuffer[PIPELINE_CACHE_NDX_CACHED], *m_pipeline[PIPELINE_CACHE_NDX_CACHED]);

	VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));
}